

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pic_test_core(stbi__context *s)

{
  int iVar1;
  char *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = stbi__pic_is4((stbi__context *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    for (iVar1 = 0; iVar1 < 0x54; iVar1 = iVar1 + 1) {
      stbi__get8((stbi__context *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    }
    iVar1 = stbi__pic_is4((stbi__context *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int stbi__pic_test_core(stbi__context *s)
{
   int i;

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34"))
      return 0;

   for(i=0;i<84;++i)
      stbi__get8(s);

   if (!stbi__pic_is4(s,"PICT"))
      return 0;

   return 1;
}